

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O2

size_t rcnb_encode_blockend(wchar_t *code_out,rcnb_encodestate *state_in)

{
  wchar_t *code_char;
  wchar_t *local_20;
  
  local_20 = code_out;
  if (state_in->cached == true) {
    rcnb_encode_byte(state_in->trailing_byte,&local_20);
  }
  *local_20 = L'\0';
  state_in->cached = false;
  return (long)local_20 - (long)code_out >> 2;
}

Assistant:

size_t rcnb_encode_blockend(wchar_t* const code_out, rcnb_encodestate* state_in)
{
    wchar_t* code_char = code_out;
    if (state_in->cached) {
        rcnb_encode_byte(*(unsigned char*)(&state_in->trailing_byte), &code_char);
    }
    *code_char = 0;
    state_in->cached = false;
    return code_char - code_out;
}